

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O0

CURLcode cf_hc_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  curltime cVar1;
  CURLcode local_84;
  undefined4 uStack_5c;
  curltime *when_1;
  undefined4 uStack_44;
  curltime *when;
  void *pres2_local;
  int *pres1_local;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 4) {
      cVar1 = cf_get_max_baller_time(cf,data,4);
      *(time_t *)pres2 = cVar1.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_44,cVar1.tv_usec);
      return CURLE_OK;
    }
    if (query == 5) {
      cVar1 = cf_get_max_baller_time(cf,data,5);
      *(time_t *)pres2 = cVar1.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_5c,cVar1.tv_usec);
      return CURLE_OK;
    }
  }
  if (cf->next == (Curl_cfilter *)0x0) {
    local_84 = CURLE_UNKNOWN_OPTION;
  }
  else {
    local_84 = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
  }
  return local_84;
}

Assistant:

static CURLcode cf_hc_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = cf_get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }
  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}